

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linenoise.c
# Opt level: O0

int enableRawMode(int fd)

{
  int iVar1;
  int *piVar2;
  undefined1 local_4c [8];
  termios raw;
  int fd_local;
  
  raw.c_ispeed = fd;
  iVar1 = isatty(0);
  if (iVar1 != 0) {
    if (atexit_registered == 0) {
      atexit(linenoiseAtExit);
      atexit_registered = 1;
    }
    iVar1 = tcgetattr(raw.c_ispeed,(termios *)&orig_termios);
    if (iVar1 != -1) {
      memcpy(local_4c,&orig_termios,0x3c);
      local_4c._0_4_ = local_4c._0_4_ & 0xfffffacd;
      local_4c._4_4_ = local_4c._4_4_ & 0xfffffffe;
      raw.c_iflag = raw.c_iflag | 0x30;
      raw.c_oflag = raw.c_oflag & 0xffff7ff4;
      raw.c_lflag._3_1_ = 1;
      raw.c_lflag._2_1_ = 0;
      iVar1 = tcsetattr(raw.c_ispeed,2,(termios *)local_4c);
      if (-1 < iVar1) {
        rawmode = 1;
        return 0;
      }
    }
  }
  piVar2 = __errno_location();
  *piVar2 = 0x19;
  return -1;
}

Assistant:

static int enableRawMode(int fd) {
    struct termios raw;

    if (!isatty(STDIN_FILENO)) goto fatal;
    if (!atexit_registered) {
        atexit(linenoiseAtExit);
        atexit_registered = 1;
    }
    if (tcgetattr(fd,&orig_termios) == -1) goto fatal;

    raw = orig_termios;  /* modify the original mode */
    /* input modes: no break, no CR to NL, no parity check, no strip char,
     * no start/stop output control. */
    raw.c_iflag &= ~(BRKINT | ICRNL | INPCK | ISTRIP | IXON);
    /* output modes - disable post processing */
    raw.c_oflag &= ~(OPOST);
    /* control modes - set 8 bit chars */
    raw.c_cflag |= (CS8);
    /* local modes - choing off, canonical off, no extended functions,
     * no signal chars (^Z,^C) */
    raw.c_lflag &= ~(ECHO | ICANON | IEXTEN | ISIG);
    /* control chars - set return condition: min number of bytes and timer.
     * We want read to return every single byte, without timeout. */
    raw.c_cc[VMIN] = 1; raw.c_cc[VTIME] = 0; /* 1 byte, no timer */

    /* put terminal in raw mode after flushing */
    if (tcsetattr(fd,TCSAFLUSH,&raw) < 0) goto fatal;
    rawmode = 1;
    return 0;

fatal:
    errno = ENOTTY;
    return -1;
}